

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t
flatcc_builder_create_buffer
          (flatcc_builder_t *B,char *identifier,uint16_t block_align,flatcc_builder_ref_t object_ref
          ,uint16_t align,flatcc_builder_buffer_flags_t flags)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  uint uVar3;
  ulong uVar4;
  uint is_nested;
  bool bVar5;
  bool bVar6;
  int local_d0;
  flatbuffers_uoffset_t buffer_size;
  flatbuffers_uoffset_t object_offset;
  uint16_t align_local;
  flatcc_iov_state_t local_c0;
  
  local_d0 = 0;
  is_nested = flags & 1;
  align_local = align;
  align_buffer_end(B,&align_local,block_align,is_nested);
  if (B->min_align < align_local) {
    B->min_align = align_local;
  }
  if (identifier == (char *)0x0) {
    uVar3 = 0xfffffffc;
    bVar5 = true;
  }
  else {
    local_d0 = *(int *)identifier;
    bVar5 = local_d0 == 0;
    uVar3 = (uint)bVar5 << 2 | 0xfffffff8;
  }
  iVar1 = B->emit_start;
  bVar6 = (flags & 3) == 0;
  if (bVar6) {
    uVar4 = 0;
  }
  else {
    local_c0.iov[0].iov_base = &buffer_size;
    local_c0.iov[0].iov_len = 4;
    uVar4 = 4;
  }
  bVar6 = !bVar6;
  uVar3 = (iVar1 - ((uint)flags * 2 & 4)) + uVar3 & align_local - 1;
  local_c0.len = uVar4 + 4;
  local_c0.iov[bVar6].iov_base = &object_offset;
  local_c0.iov[bVar6].iov_len = 4;
  local_c0.count = bVar6 + 1;
  if (!bVar5) {
    local_c0.len = uVar4 | 8;
    *(int **)((long)&local_c0.iov[0].iov_base + (ulong)(uint)(local_c0.count * 0x10)) = &local_d0;
    *(undefined8 *)((long)&local_c0.iov[0].iov_len + (ulong)(uint)(local_c0.count * 0x10)) = 4;
    local_c0.count = bVar6 | 2;
  }
  if (uVar3 != 0) {
    local_c0.len = local_c0.len + uVar3;
    *(uint8_t **)((long)&local_c0.iov[0].iov_base + (ulong)(uint)(local_c0.count << 4)) = "";
    *(ulong *)((long)&local_c0.iov[0].iov_len + (ulong)(uint)(local_c0.count << 4)) = (ulong)uVar3;
    local_c0.count = local_c0.count + 1;
  }
  iVar1 = (iVar1 - (int)local_c0.len) + (uint)((flags & 3) != 0) * 4;
  buffer_size = (&B->emit_end)[is_nested] - iVar1;
  object_offset = object_ref - iVar1;
  fVar2 = emit_front(B,&local_c0);
  if (fVar2 != 0) {
    return fVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x313,
                "flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *, const char *, uint16_t, flatcc_builder_ref_t, uint16_t, flatcc_builder_buffer_flags_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *B,
        const char identifier[identifier_size], uint16_t block_align,
        flatcc_builder_ref_t object_ref, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    flatcc_builder_ref_t buffer_ref;
    uoffset_t header_pad, id_size = 0;
    uoffset_t object_offset, buffer_size, buffer_base;
    iov_state_t iov;
    flatcc_builder_identifier_t id_out = 0;
    int is_nested = (flags & flatcc_builder_is_nested) != 0;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, is_nested)) {
        return 0;
    }
    set_min_align(B, align);
    if (identifier) {
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == identifier_size);
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == field_size);
        memcpy(&id_out, identifier, identifier_size);
        id_out = __flatbuffers_thash_read_from_le(&id_out);
        write_identifier(&id_out, id_out);
    }
    id_size = id_out ? identifier_size : 0;
    header_pad = front_pad(B, field_size + id_size + (uoffset_t)(with_size ? field_size : 0), align);
    init_iov();
    /* ubyte vectors size field wrapping nested buffer. */
    push_iov_cond(&buffer_size, field_size, is_nested || with_size);
    push_iov(&object_offset, field_size);
    /* Identifiers are not always present in buffer. */
    push_iov(&id_out, id_size);
    push_iov(_pad, header_pad);
    buffer_base = (uoffset_t)B->emit_start - (uoffset_t)iov.len + (uoffset_t)((is_nested || with_size) ? field_size : 0);
    if (is_nested) {
        write_uoffset(&buffer_size, (uoffset_t)B->buffer_mark - buffer_base);
    } else {
        /* Also include clustered vtables. */
        write_uoffset(&buffer_size, (uoffset_t)B->emit_end - buffer_base);
    }
    write_uoffset(&object_offset, (uoffset_t)object_ref - buffer_base);
    if (0 == (buffer_ref = emit_front(B, &iov))) {
        check(0, "emitter rejected buffer content");
        return 0;
    }
    return buffer_ref;
}